

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O1

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::set_status
          (ImporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,
          HalfedgeHandle _heh,StatusInfo *_status)

{
  if (*(int *)((ArrayKernel *)this->mesh_ + 0xac) < 0) {
    ArrayKernel::request_halfedge_status((ArrayKernel *)this->mesh_);
  }
  *(value_type_conflict2 *)
   (*(long *)(*(long *)(*(long *)&(this->mesh_->super_Mesh).
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                  .super_PolyConnectivity.field_0x30 +
                       (long)*(int *)&(this->mesh_->super_Mesh).
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                      .super_PolyConnectivity.field_0xac * 8) + 0x30) +
   (long)(int)_heh.super_BaseHandle.idx_ * 4) = _status->status_;
  return;
}

Assistant:

virtual void set_status(HalfedgeHandle _heh, const OpenMesh::Attributes::StatusInfo& _status) override
  {
    if (!mesh_.has_halfedge_status())
      mesh_.request_halfedge_status();
    mesh_.status(_heh) = _status;
  }